

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

int google::protobuf::UnescapeCEscapeString
              (string *src,string *dest,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *errors)

{
  int iVar1;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> dest_00;
  LogMessage *other;
  LogFinisher local_69;
  unique_ptr<char[],_std::default_delete<char[]>_> unescaped;
  LogMessage local_60;
  
  dest_00._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)operator_new__(src->_M_string_length + 1);
  unescaped._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 dest_00._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  iVar1 = UnescapeCEscapeSequences
                    ((src->_M_dataplus)._M_p,
                     (char *)dest_00._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl,errors);
  if (dest == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x1c8);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: dest: ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_60);
    dest_00._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)
         (tuple<char_*,_std::default_delete<char[]>_>)unescaped;
  }
  std::__cxx11::string::assign
            ((char *)dest,
             (ulong)dest_00._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&unescaped);
  return iVar1;
}

Assistant:

int UnescapeCEscapeString(const std::string &src, std::string *dest,
                          std::vector<std::string> *errors) {
  std::unique_ptr<char[]> unescaped(new char[src.size() + 1]);
  int len = UnescapeCEscapeSequences(src.c_str(), unescaped.get(), errors);
  GOOGLE_CHECK(dest);
  dest->assign(unescaped.get(), len);
  return len;
}